

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

iter_type __thiscall
booster::locale::impl_icu::num_format<char>::do_real_put<unsigned_long>
          (num_format<char> *this,iter_type out,ios_base *ios,char_type fill,unsigned_long val)

{
  formatter<char> fVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  streamsize n;
  long lVar7;
  iter_type iVar8;
  iter_type iVar9;
  size_t code_points;
  long local_58;
  formatter<char> local_50;
  long local_48;
  undefined1 local_40 [16];
  
  iVar9._M_sbuf = out._M_sbuf;
  uVar5 = out._8_4_;
  bVar2 = num_base::use_parent<unsigned_long>(ios,val);
  if ((bVar2) ||
     (formatter<char>::create(&local_50,ios,&this->loc_,&this->enc_),
     fVar1.super_base_formatter._vptr_base_formatter =
          local_50.super_base_formatter._vptr_base_formatter,
     local_50.super_base_formatter._vptr_base_formatter == (_func_int **)0x0)) {
    iVar9._8_4_ = uVar5 & 0xff;
    iVar9._12_4_ = 0;
    iVar9 = std::num_put<char,_std::ostreambuf_iterator<char,_std::char_traits<char>_>_>::
            _M_insert_int<unsigned_long>
                      (&this->
                        super_num_put<char,_std::ostreambuf_iterator<char,_std::char_traits<char>_>_>
                       ,iVar9,ios,fill,val);
    uVar5 = iVar9._8_4_;
  }
  else {
    (**(code **)(*(_func_int **)local_50.super_base_formatter._vptr_base_formatter + 0x18))
              (&local_50,local_50.super_base_formatter._vptr_base_formatter,val);
    lVar7 = *(long *)(ios + 0x10) - local_58;
    if (lVar7 == 0 || *(long *)(ios + 0x10) < local_58) {
      lVar6 = 0;
    }
    else {
      lVar4 = 0;
      if ((*(uint *)(ios + 0x18) & 0xb0) != 0x20) {
        lVar4 = lVar7;
      }
      lVar6 = lVar7 - lVar4;
      if (0 < lVar4) {
        lVar7 = lVar7 + 1;
        do {
          if ((uVar5 & 1) == 0) {
            if (*(char_type **)(iVar9._M_sbuf + 0x28) < *(char_type **)(iVar9._M_sbuf + 0x30)) {
              **(char_type **)(iVar9._M_sbuf + 0x28) = fill;
              *(long *)(iVar9._M_sbuf + 0x28) = *(long *)(iVar9._M_sbuf + 0x28) + 1;
            }
            else {
              iVar3 = (**(code **)(*(long *)iVar9._M_sbuf + 0x68))(iVar9._M_sbuf);
              uVar5 = uVar5 & 0xff;
              if (iVar3 == -1) {
                uVar5 = 1;
              }
            }
          }
          lVar7 = lVar7 + -1;
        } while (1 < lVar7);
      }
    }
    if ((0 < local_48) && ((uVar5 & 1) == 0)) {
      (**(code **)(*(long *)iVar9._M_sbuf + 0x60))
                (iVar9._M_sbuf,local_50.super_base_formatter._vptr_base_formatter);
    }
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      do {
        if ((uVar5 & 1) == 0) {
          if (*(char_type **)(iVar9._M_sbuf + 0x28) < *(char_type **)(iVar9._M_sbuf + 0x30)) {
            **(char_type **)(iVar9._M_sbuf + 0x28) = fill;
            *(long *)(iVar9._M_sbuf + 0x28) = *(long *)(iVar9._M_sbuf + 0x28) + 1;
          }
          else {
            iVar3 = (**(code **)(*(long *)iVar9._M_sbuf + 0x68))(iVar9._M_sbuf,fill);
            uVar5 = uVar5 & 0xff;
            if (iVar3 == -1) {
              uVar5 = 1;
            }
          }
        }
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    *(undefined8 *)(ios + 0x10) = 0;
    if (local_50.super_base_formatter._vptr_base_formatter != (base_formatter)local_40) {
      operator_delete((void *)local_50.super_base_formatter._vptr_base_formatter);
    }
    (**(code **)(*(_func_int **)fVar1.super_base_formatter._vptr_base_formatter + 8))();
  }
  iVar8._8_4_ = uVar5;
  iVar8._M_sbuf = iVar9._M_sbuf;
  iVar8._12_4_ = 0;
  return iVar8;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        formatter_ptr formatter;
        
        if(use_parent<ValueType>(ios,val) || (formatter = formatter_type::create(ios,loc_,enc_)).get() == 0) {
            return std::num_put<char_type>::do_put(out,ios,fill,val);
        }
        
        size_t code_points;
        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type const &str = formatter->format(static_cast<cast_type>(val),code_points);
        std::streamsize on_left=0,on_right = 0,points = code_points;
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // We do not really know internal point, so we assume that it does not
            // exist. So according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;

    }